

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O2

int32_t __thiscall icu_63::CollationRootElements::findP(CollationRootElements *this,uint32_t p)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  long lVar7;
  
  puVar1 = this->elements;
  uVar2 = puVar1[2];
  uVar6 = this->length - 1;
LAB_00239c48:
  uVar4 = uVar2;
  if ((int)uVar6 <= (int)(uVar4 + 1)) {
    return uVar4;
  }
  uVar3 = (int)(uVar6 + uVar4) / 2;
  lVar7 = (long)(int)uVar3;
  uVar5 = puVar1[lVar7];
  if ((char)uVar5 < '\0') {
    do {
      if ((long)(int)uVar6 + -1 == lVar7) {
        if (-1 < (char)uVar5) goto LAB_00239c9b;
        lVar7 = (long)(int)uVar3;
        goto LAB_00239c87;
      }
      uVar5 = puVar1[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while ((char)uVar5 < '\0');
    goto LAB_00239c98;
  }
  goto LAB_00239c9b;
  while( true ) {
    uVar5 = puVar1[lVar7 + -1];
    lVar7 = lVar7 + -1;
    if (-1 < (char)uVar5) break;
LAB_00239c87:
    if ((long)(int)uVar4 + 1 == lVar7) {
      if ((char)uVar5 < '\0') {
        return uVar4;
      }
      goto LAB_00239c9b;
    }
  }
LAB_00239c98:
  uVar3 = (uint32_t)lVar7;
LAB_00239c9b:
  uVar2 = uVar3;
  if (p < (uVar5 & 0xffffff00)) {
    uVar2 = uVar4;
    uVar6 = uVar3;
  }
  goto LAB_00239c48;
}

Assistant:

int32_t
CollationRootElements::findP(uint32_t p) const {
    // p need not occur as a root primary.
    // For example, it might be a reordering group boundary.
    U_ASSERT((p >> 24) != Collation::UNASSIGNED_IMPLICIT_BYTE);
    // modified binary search
    int32_t start = (int32_t)elements[IX_FIRST_PRIMARY_INDEX];
    U_ASSERT(p >= elements[start]);
    int32_t limit = length - 1;
    U_ASSERT(elements[limit] >= PRIMARY_SENTINEL);
    U_ASSERT(p < elements[limit]);
    while((start + 1) < limit) {
        // Invariant: elements[start] and elements[limit] are primaries,
        // and elements[start]<=p<=elements[limit].
        int32_t i = (start + limit) / 2;
        uint32_t q = elements[i];
        if((q & SEC_TER_DELTA_FLAG) != 0) {
            // Find the next primary.
            int32_t j = i + 1;
            for(;;) {
                if(j == limit) { break; }
                q = elements[j];
                if((q & SEC_TER_DELTA_FLAG) == 0) {
                    i = j;
                    break;
                }
                ++j;
            }
            if((q & SEC_TER_DELTA_FLAG) != 0) {
                // Find the preceding primary.
                j = i - 1;
                for(;;) {
                    if(j == start) { break; }
                    q = elements[j];
                    if((q & SEC_TER_DELTA_FLAG) == 0) {
                        i = j;
                        break;
                    }
                    --j;
                }
                if((q & SEC_TER_DELTA_FLAG) != 0) {
                    // No primary between start and limit.
                    break;
                }
            }
        }
        if(p < (q & 0xffffff00)) {  // Reset the "step" bits of a range end primary.
            limit = i;
        } else {
            start = i;
        }
    }
    return start;
}